

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O0

LArYieldResult * __thiscall
NEST::LArNEST::GetNRYields
          (LArYieldResult *__return_storage_ptr__,LArNEST *this,double energy,double efield,
          double density)

{
  double TotalYields;
  undefined8 local_40;
  double NRPhotonYields;
  double NRElectronYields;
  double NRTotalYields;
  double density_local;
  double efield_local;
  double energy_local;
  LArNEST *this_local;
  
  TotalYields = GetNRTotalYields(this,energy);
  NRPhotonYields = GetNRElectronYields(this,energy,efield);
  if (NRPhotonYields < 0.0) {
    NRPhotonYields = 0.0;
  }
  local_40 = GetNRPhotonYields(this,energy,efield);
  if (local_40 < 0.0) {
    local_40 = 0.0;
  }
  GetRecombinationYields
            (__return_storage_ptr__,this,TotalYields,NRPhotonYields,local_40,energy,efield);
  return __return_storage_ptr__;
}

Assistant:

LArYieldResult LArNEST::GetNRYields(double energy, double efield,
                                    double density) {
  double NRTotalYields = GetNRTotalYields(energy);
  double NRElectronYields = GetNRElectronYields(energy, efield);
  if (NRElectronYields < 0.0) {
    NRElectronYields = 0.0;
  }
  double NRPhotonYields = GetNRPhotonYields(energy, efield);
  if (NRPhotonYields < 0.0) {
    NRPhotonYields = 0.0;
  }
  return GetRecombinationYields(NRTotalYields, NRElectronYields, NRPhotonYields,
                                energy, efield);
}